

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O0

void unlock_fd(int fd)

{
  undefined2 local_30;
  undefined2 local_2e;
  flock sflock;
  int fd_local;
  
  if (fd != -1) {
    local_30 = 2;
    local_2e = 0;
    sflock.l_type = 0;
    sflock.l_whence = 0;
    sflock._4_4_ = 0;
    sflock.l_start = 0;
    sflock._28_4_ = fd;
    fcntl(fd,6,&local_30);
  }
  return;
}

Assistant:

void unlock_fd(int fd)
{
    struct flock sflock;
    
    if (fd == -1)
	return;
    
    sflock.l_type = F_UNLCK;
    sflock.l_whence = SEEK_SET;
    sflock.l_start = 0;
    sflock.l_len = 0;
    
    fcntl(fd, F_SETLK, &sflock);
}